

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

void ImGui_ImplOpenGL3_SetupRenderState
               (ImDrawData *draw_data,int fb_width,int fb_height,GLuint vertex_array_object)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float local_88 [2];
  float ortho_projection [4] [4];
  float local_40;
  float tmp;
  float B;
  float T;
  float R;
  float L;
  GLenum current_clip_origin;
  bool clip_origin_lower_left;
  ImGui_ImplOpenGL3_Data *bd;
  int local_18;
  GLuint vertex_array_object_local;
  int fb_height_local;
  int fb_width_local;
  ImDrawData *draw_data_local;
  
  bd._4_4_ = vertex_array_object;
  local_18 = fb_height;
  vertex_array_object_local = fb_width;
  _fb_height_local = draw_data;
  _current_clip_origin = ImGui_ImplOpenGL3_GetBackendData();
  (*_ptrc_glEnable)(0xbe2);
  (*_ptrc_glBlendEquation)(0x8006);
  (*_ptrc_glBlendFuncSeparate)(0x302,0x303,1,0x303);
  (*_ptrc_glDisable)(0xb44);
  (*_ptrc_glDisable)(0xb71);
  (*_ptrc_glDisable)(0xb90);
  (*_ptrc_glEnable)(0xc11);
  (*_ptrc_glPolygonMode)(0x408,0x1b02);
  L._3_1_ = 1;
  if ((_current_clip_origin->HasClipOrigin & 1U) != 0) {
    R = 0.0;
    (*_ptrc_glGetIntegerv)(0x935c,(GLint *)&R);
    if (R == 5.04495e-41) {
      L._3_1_ = 0;
    }
  }
  (*_ptrc_glViewport)(0,0,vertex_array_object_local,local_18);
  fVar1 = (_fb_height_local->DisplayPos).x;
  fVar2 = (_fb_height_local->DisplayPos).x + (_fb_height_local->DisplaySize).x;
  tmp = (_fb_height_local->DisplayPos).y;
  fVar3 = (_fb_height_local->DisplayPos).y + (_fb_height_local->DisplaySize).y;
  local_40 = fVar3;
  if ((L._3_1_ & 1) == 0) {
    ortho_projection[3][3] = tmp;
    local_40 = tmp;
    tmp = fVar3;
  }
  local_88[0] = 2.0 / (fVar2 - fVar1);
  local_88[1] = 0.0;
  ortho_projection[0][0] = 0.0;
  ortho_projection[0][1] = 0.0;
  ortho_projection[0][2] = 0.0;
  ortho_projection[0][3] = 2.0 / (tmp - local_40);
  ortho_projection[1][0] = 0.0;
  ortho_projection[1][1] = 0.0;
  ortho_projection[1][2] = 0.0;
  ortho_projection[1][3] = 0.0;
  ortho_projection[2][0] = -1.0;
  ortho_projection[2][1] = 0.0;
  ortho_projection[2][2] = (fVar2 + fVar1) / (fVar1 - fVar2);
  ortho_projection[2][3] = (tmp + local_40) / (local_40 - tmp);
  ortho_projection[3][0] = 0.0;
  ortho_projection[3][1] = 1.0;
  (*_ptrc_glUseProgram)(_current_clip_origin->ShaderHandle);
  (*_ptrc_glUniform1i)(_current_clip_origin->AttribLocationTex,0);
  (*_ptrc_glUniformMatrix4fv)(_current_clip_origin->AttribLocationProjMtx,1,'\0',local_88);
  (*_ptrc_glBindVertexArray)(bd._4_4_);
  (*_ptrc_glBindBuffer)(0x8892,_current_clip_origin->VboHandle);
  (*_ptrc_glBindBuffer)(0x8893,_current_clip_origin->ElementsHandle);
  (*_ptrc_glEnableVertexAttribArray)(_current_clip_origin->AttribLocationVtxPos);
  (*_ptrc_glEnableVertexAttribArray)(_current_clip_origin->AttribLocationVtxUV);
  (*_ptrc_glEnableVertexAttribArray)(_current_clip_origin->AttribLocationVtxColor);
  (*_ptrc_glVertexAttribPointer)
            (_current_clip_origin->AttribLocationVtxPos,2,0x1406,'\0',0x14,(void *)0x0);
  (*_ptrc_glVertexAttribPointer)
            (_current_clip_origin->AttribLocationVtxUV,2,0x1406,'\0',0x14,(void *)0x8);
  (*_ptrc_glVertexAttribPointer)
            (_current_clip_origin->AttribLocationVtxColor,4,0x1401,'\x01',0x14,(void *)0x10);
  return;
}

Assistant:

static void ImGui_ImplOpenGL3_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height, GLuint vertex_array_object)
{
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();

    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_STENCIL_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (bd->GlVersion >= 310)
        glDisable(GL_PRIMITIVE_RESTART);
#endif
#ifdef IMGUI_IMPL_HAS_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)
#if defined(GL_CLIP_ORIGIN)
    bool clip_origin_lower_left = true;
    if (bd->HasClipOrigin)
    {
        GLenum current_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&current_clip_origin);
        if (current_clip_origin == GL_UPPER_LEFT)
            clip_origin_lower_left = false;
    }
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
#if defined(GL_CLIP_ORIGIN)
    if (!clip_origin_lower_left) { float tmp = T; T = B; B = tmp; } // Swap top and bottom if origin is upper left
#endif
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(bd->ShaderHandle);
    glUniform1i(bd->AttribLocationTex, 0);
    glUniformMatrix4fv(bd->AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);

#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (bd->GlVersion >= 330)
        glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.
#endif

    (void)vertex_array_object;
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindVertexArray(vertex_array_object);
#endif

    // Bind vertex/index buffers and setup attributes for ImDrawVert
    glBindBuffer(GL_ARRAY_BUFFER, bd->VboHandle);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, bd->ElementsHandle);
    glEnableVertexAttribArray(bd->AttribLocationVtxPos);
    glEnableVertexAttribArray(bd->AttribLocationVtxUV);
    glEnableVertexAttribArray(bd->AttribLocationVtxColor);
    glVertexAttribPointer(bd->AttribLocationVtxPos,   2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(bd->AttribLocationVtxUV,    2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(bd->AttribLocationVtxColor, 4, GL_UNSIGNED_BYTE, GL_TRUE,  sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));
}